

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  __node_base *p_Var7;
  ulong uVar8;
  char *pcVar9;
  int current;
  bool matched;
  int local_15c;
  char **local_158;
  allocator<char> local_149;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_148;
  const_iterator next_positional;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  ArguDesc argu_desc;
  string name;
  shared_ptr<cxxopts::OptionDetails> value;
  string arg_value;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_68;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_48;
  
  current = 1;
  next_positional._M_current =
       (this->m_positional->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15c = argc;
  local_158 = argv;
  while (iVar4 = current, current != local_15c) {
    pcVar9 = local_158[current];
    if (((*pcVar9 == '-') && (pcVar9[1] == '-')) && (pcVar9[2] == '\0')) {
      current = current + 1;
      break;
    }
    matched = false;
    values::parser_tool::ParseArgument(&argu_desc,pcVar9,&matched);
    if (matched == false) {
      pcVar9 = local_158[current];
      if (((*pcVar9 == '-') && (pcVar9[1] != '\0')) && (this->m_allow_unrecognised == false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar9,(allocator<char> *)&arg_value);
        throw_or_mimic<cxxopts::exceptions::invalid_option_syntax>(&name);
        std::__cxx11::string::~string((string *)&name);
        pcVar9 = local_158[current];
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,pcVar9,(allocator<char> *)&arg_value);
      bVar2 = consume_positional(this,&name,&next_positional);
      std::__cxx11::string::~string((string *)&name);
      if (!bVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unmatched,
                   local_158 + current);
      }
    }
    else {
      if (argu_desc.grouping == true) {
        uVar8 = 0;
LAB_00120211:
        do {
          if (uVar8 == argu_desc.arg_name._M_string_length) goto LAB_001204df;
          name._M_dataplus._M_p = (pointer)&name.field_2;
          std::__cxx11::string::_M_construct((ulong)&name,'\x01');
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this->m_options->_M_h,&name);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            if (this->m_allow_unrecognised == true) {
              std::__cxx11::string::string<std::allocator<char>>((string *)&value,"-",&local_149);
              std::operator+(&arg_value,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &value,argu_desc.arg_name._M_dataplus._M_p[uVar8]);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &unmatched,&arg_value);
              std::__cxx11::string::~string((string *)&arg_value);
              std::__cxx11::string::~string((string *)&value);
              std::__cxx11::string::~string((string *)&name);
              uVar8 = uVar8 + 1;
              goto LAB_00120211;
            }
            throw_or_mimic<cxxopts::exceptions::no_such_option>(&name);
          }
          std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)&value,
                     (__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)cVar5.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                            ._M_cur + 0x28));
          uVar8 = uVar8 + 1;
          if (uVar8 == argu_desc.arg_name._M_string_length) {
            checked_parse_arg(this,local_15c,local_158,&current,&value,&name);
          }
          else {
            iVar4 = (*(((value.
                         super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_value).
                       super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->_vptr_Value[7])();
            if ((char)iVar4 == '\0') {
              if (uVar8 < argu_desc.arg_name._M_string_length) {
                std::__cxx11::string::substr((ulong)&arg_value,(ulong)&argu_desc);
                parse_option(this,&value,&name,&arg_value);
                std::__cxx11::string::~string((string *)&arg_value);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&value.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::string::~string((string *)&name);
                goto LAB_001204df;
              }
              throw_or_mimic<cxxopts::exceptions::option_requires_argument>(&name);
            }
            else {
              (*(((value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_value).
                 super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Value[9])(&arg_value);
              parse_option(this,&value,&name,&arg_value);
              std::__cxx11::string::~string((string *)&arg_value);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&name);
        } while( true );
      }
      if (argu_desc.arg_name._M_string_length != 0) {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this->m_options->_M_h,&argu_desc.arg_name);
        if (cVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (this->m_allow_unrecognised == true) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &unmatched,local_158 + current);
            goto LAB_001204df;
          }
          throw_or_mimic<cxxopts::exceptions::no_such_option>(&argu_desc.arg_name);
        }
        std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)&name,
                   (__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)cVar5.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                          ._M_cur + 0x28));
        if (argu_desc.set_value == true) {
          parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)&name,&argu_desc.arg_name,
                       &argu_desc.value);
        }
        else {
          checked_parse_arg(this,local_15c,local_158,&current,
                            (shared_ptr<cxxopts::OptionDetails> *)&name,&argu_desc.arg_name);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length);
      }
    }
LAB_001204df:
    current = current + 1;
    values::parser_tool::ArguDesc::~ArguDesc(&argu_desc);
  }
  p_Var7 = &(this->m_options->_M_h)._M_before_begin;
  local_148 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&this->m_parsed;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    p_Var1 = p_Var7[5]._M_nxt[0xb]._M_nxt;
    argu_desc.arg_name._M_dataplus._M_p = (pointer)p_Var7[5]._M_nxt[0xe]._M_nxt;
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_148,(key_type *)&argu_desc);
    cVar3 = (*(code *)p_Var1->_M_nxt[5]._M_nxt)(p_Var1);
    if (cVar3 == '\0') {
      parse_no_value(this,(shared_ptr<cxxopts::OptionDetails> *)(p_Var7 + 5));
    }
    else if ((pmVar6->m_count == 0) && (pmVar6->m_default == false)) {
      parse_default(this,(shared_ptr<cxxopts::OptionDetails> *)(p_Var7 + 5));
    }
  }
  if (iVar4 != local_15c) {
    for (; current < local_15c; current = current + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&argu_desc,local_158[current],(allocator<char> *)&name);
      bVar2 = consume_positional(this,&argu_desc.arg_name,&next_positional);
      std::__cxx11::string::~string((string *)&argu_desc);
      if (!bVar2) break;
    }
    for (; current != local_15c; current = current + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unmatched,
                 local_158 + current);
    }
  }
  finalise_aliases(this);
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseResult::ParseResult
            (__return_storage_ptr__,&this->m_keys,(ParsedHashMap *)local_148,&local_48,&local_68,
             &unmatched);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_68);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unmatched);
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  auto next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }
    bool matched = false;
    values::parser_tool::ArguDesc argu_desc =
        values::parser_tool::ParseArgument(argv[current], matched);

    if (!matched)
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<exceptions::invalid_option_syntax>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.emplace_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (argu_desc.grouping)
      {
        const std::string& s = argu_desc.arg_name;

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              unmatched.push_back(std::string("-") + s[i]);
              continue;
            }
            //error
            throw_or_mimic<exceptions::no_such_option>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else if (i + 1 < s.size())
          {
            std::string arg_value = s.substr(i + 1);
            parse_option(value, name, arg_value);
            break;
          }
          else
          {
            //error
            throw_or_mimic<exceptions::option_requires_argument>(name);
          }
        }
      }
      else if (argu_desc.arg_name.length() != 0)
      {
        const std::string& name = argu_desc.arg_name;

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.emplace_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<exceptions::no_such_option>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (argu_desc.set_value)
        {
          //parse the option given

          parse_option(opt, name, argu_desc.value);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if (value.has_default()) {
      if (!store.count() && !store.has_default()) {
        parse_default(detail);
      }
    }
    else {
      parse_no_value(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.emplace_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(m_defaults), std::move(unmatched));
  return parsed;
}